

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_dotset_value(JSON_Object *object,char *name,JSON_Value *value)

{
  JSON_Value_Type JVar1;
  JSON_Value *value_00;
  char *string;
  JSON_Value *pJVar2;
  char *in_RDX;
  JSON_Object *in_RSI;
  long in_RDI;
  char *unaff_retaddr;
  char *name_copy;
  size_t name_len;
  JSON_Status status;
  JSON_Object *new_object;
  JSON_Object *temp_object;
  JSON_Value *new_value;
  JSON_Value *temp_value;
  char *dot_pos;
  JSON_Value *pJVar3;
  parson_bool_t free_value;
  undefined4 in_stack_ffffffffffffffb0;
  size_t name_len_00;
  char *name_00;
  JSON_Object *pJVar4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  JSON_Status JVar5;
  
  pJVar4 = (JSON_Object *)0x0;
  name_00 = (char *)0x0;
  name_len_00 = 0;
  pJVar3 = (JSON_Value *)0x0;
  if (((in_RDI == 0) || (in_RSI == (JSON_Object *)0x0)) || (in_RDX == (char *)0x0)) {
    JVar5 = -1;
  }
  else {
    value_00 = (JSON_Value *)strchr((char *)in_RSI,0x2e);
    if (value_00 == (JSON_Value *)0x0) {
      JVar5 = json_object_set_value
                        ((JSON_Object *)name_copy,unaff_retaddr,
                         (JSON_Value *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                        );
    }
    else {
      string = (char *)((long)value_00 - (long)in_RSI);
      pJVar2 = json_object_getn_value(pJVar4,name_00,name_len_00);
      if (pJVar2 == (JSON_Value *)0x0) {
        pJVar2 = json_value_init_object();
        if (pJVar2 == (JSON_Value *)0x0) {
          JVar5 = -1;
        }
        else {
          pJVar4 = json_value_get_object(pJVar3);
          JVar5 = json_object_dotset_value(in_RSI,in_RDX,value_00);
          if (JVar5 == 0) {
            pJVar3 = (JSON_Value *)parson_strndup(string,(size_t)pJVar3);
            free_value = (parson_bool_t)((ulong)string >> 0x20);
            if (pJVar3 == (JSON_Value *)0x0) {
              json_object_dotremove_internal
                        (pJVar4,(char *)CONCAT44(JVar5,in_stack_ffffffffffffffb0),free_value);
              json_value_free(pJVar3);
              JVar5 = -1;
            }
            else {
              JVar5 = json_object_add(in_RSI,in_RDX,value_00);
              if (JVar5 == 0) {
                JVar5 = 0;
              }
              else {
                (*parson_free)(pJVar3);
                json_object_dotremove_internal
                          (pJVar4,(char *)CONCAT44(JVar5,in_stack_ffffffffffffffb0),free_value);
                json_value_free(pJVar3);
                JVar5 = -1;
              }
            }
          }
          else {
            json_value_free(pJVar3);
            JVar5 = -1;
          }
        }
      }
      else {
        JVar1 = json_value_get_type(pJVar2);
        if (JVar1 == 4) {
          json_value_get_object(pJVar3);
          JVar5 = json_object_dotset_value(in_RSI,in_RDX,value_00);
        }
        else {
          JVar5 = -1;
        }
      }
    }
  }
  return JVar5;
}

Assistant:

JSON_Status json_object_dotset_value(JSON_Object *object, const char *name, JSON_Value *value) {
    const char *dot_pos = NULL;
    JSON_Value *temp_value = NULL, *new_value = NULL;
    JSON_Object *temp_object = NULL, *new_object = NULL;
    JSON_Status status = JSONFailure;
    size_t name_len = 0;
    char *name_copy = NULL;
    
    if (object == NULL || name == NULL || value == NULL) {
        return JSONFailure;
    }
    dot_pos = strchr(name, '.');
    if (dot_pos == NULL) {
        return json_object_set_value(object, name, value);
    }
    name_len = dot_pos - name;
    temp_value = json_object_getn_value(object, name, name_len);
    if (temp_value) {
        /* Don't overwrite existing non-object (unlike json_object_set_value, but it shouldn't be changed at this point) */
        if (json_value_get_type(temp_value) != JSONObject) {
            return JSONFailure;
        }
        temp_object = json_value_get_object(temp_value);
        return json_object_dotset_value(temp_object, dot_pos + 1, value);
    }
    new_value = json_value_init_object();
    if (new_value == NULL) {
        return JSONFailure;
    }
    new_object = json_value_get_object(new_value);
    status = json_object_dotset_value(new_object, dot_pos + 1, value);
    if (status != JSONSuccess) {
        json_value_free(new_value);
        return JSONFailure;
    }
    name_copy = parson_strndup(name, name_len);
    if (!name_copy) {
        json_object_dotremove_internal(new_object, dot_pos + 1, 0);
        json_value_free(new_value);
        return JSONFailure;
    }
    status = json_object_add(object, name_copy, new_value);
    if (status != JSONSuccess) {
        parson_free(name_copy);
        json_object_dotremove_internal(new_object, dot_pos + 1, 0);
        json_value_free(new_value);
        return JSONFailure;
    }
    return JSONSuccess;
}